

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.cpp
# Opt level: O1

bool __thiscall
GmmLib::Table::TrackTableUsage
          (Table *this,TT_TYPE Type,bool IsL1,GMM_GFX_ADDRESS TileAdr,bool NullMapped,
          GMM_LIB_CONTEXT *pGmmLibContext)

{
  ulong uVar1;
  long lVar2;
  undefined7 in_register_00000011;
  uint uVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  
  if ((int)CONCAT71(in_register_00000011,IsL1) == 0) {
    uVar3 = (uint)(TileAdr >> 0x18) & 0xfff;
  }
  else {
    uVar1 = *(ulong *)&(pGmmLibContext->WaTable).field_0x4;
    bVar5 = ((uVar1 >> 0x2f & 1) == 0) << 2 | 2;
    if ((uVar1 >> 0x2e & 1) != 0) {
      bVar5 = 0;
    }
    uVar3 = ((uint)(TileAdr >> 0xe) & 0x3ff) >> bVar5;
  }
  uVar6 = 1 << ((byte)uVar3 & 0x1f);
  if (NullMapped) {
    this->UsedEntries[uVar3 >> 5] = this->UsedEntries[uVar3 >> 5] & ~uVar6;
    lVar2 = 0x80;
    if ((IsL1) && (lVar2 = 0x20, ((pGmmLibContext->WaTable).field_0x9 & 0x40) == 0)) {
      lVar2 = 8;
    }
    lVar4 = 0;
    do {
      if (this->UsedEntries[lVar4] != 0) {
        return false;
      }
      lVar4 = lVar4 + 1;
    } while (lVar2 != lVar4);
  }
  else {
    this->UsedEntries[uVar3 >> 5] = this->UsedEntries[uVar3 >> 5] | uVar6;
  }
  return NullMapped;
}

Assistant:

bool GmmLib::Table::TrackTableUsage(TT_TYPE Type, bool IsL1, GMM_GFX_ADDRESS TileAdr, bool NullMapped, GMM_LIB_CONTEXT *pGmmLibContext )
{
    uint32_t EntryIdx;
    uint32_t ElemNum = 0, BitNum = 0;

    EntryIdx = IsL1 ? static_cast<uint32_t>(GMM_L1_ENTRY_IDX(Type, TileAdr, pGmmLibContext)) : static_cast<uint32_t>(GMM_L2_ENTRY_IDX(Type, TileAdr));

    ElemNum = EntryIdx / (sizeof(UsedEntries[0]) * 8);
    BitNum  = EntryIdx % (sizeof(UsedEntries[0]) * 8);

    if(NullMapped)
    {
        UsedEntries[ElemNum] &= ~(1 << BitNum);
    }
    else
    {
        UsedEntries[ElemNum] |= (1 << BitNum);
    }

    if(NullMapped)
    {
        int TableDWSize = IsL1 ? static_cast<int>(GMM_L1_SIZE_DWORD(Type,  pGmmLibContext)) : static_cast<int>(GMM_L2_SIZE_DWORD(Type));
        for(int i = 0; i < TableDWSize; i++)
        {
            if(UsedEntries[i])
            {
                return false;
            }
        }
    }
    return NullMapped ? true : false;
}